

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeInit(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr,
             int isCreate)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  Rtree *pRtree_00;
  sqlite3_str *p;
  char *pcVar5;
  ulong uVar6;
  undefined8 local_a8;
  char *aErrMsg [5];
  uint local_78;
  int local_74;
  int iErr;
  int ii;
  char *zSql;
  sqlite3_str *pSql;
  int eCoordType;
  int nName;
  int nDb;
  Rtree *pRtree;
  int rc;
  char **pzErr_local;
  sqlite3_vtab **ppVtab_local;
  char **argv_local;
  int argc_local;
  void *pAux_local;
  sqlite3 *db_local;
  
  memcpy(&local_a8,&DAT_0025ab50,0x28);
  if (argc < 0x68) {
    sqlite3_vtab_config(db,1);
    sVar4 = strlen(argv[1]);
    iVar1 = (int)sVar4;
    sVar4 = strlen(argv[2]);
    iVar2 = (int)sVar4;
    pRtree_00 = (Rtree *)sqlite3_malloc64((long)iVar1 + (long)iVar2 + 0x3ca);
    if (pRtree_00 == (Rtree *)0x0) {
      db_local._4_4_ = 7;
    }
    else {
      memset(pRtree_00,0,(long)iVar1 + (long)iVar2 + 0x3ca);
      pRtree_00->nBusy = 1;
      (pRtree_00->base).pModule = &rtreeModule;
      pRtree_00->zDb = (char *)(pRtree_00 + 1);
      pRtree_00->zName = pRtree_00->zDb + (iVar1 + 1);
      pRtree_00->eCoordType = pAux != (void *)0x0;
      memcpy(pRtree_00->zDb,argv[1],(long)iVar1);
      memcpy(pRtree_00->zName,argv[2],(long)iVar2);
      p = sqlite3_str_new(db);
      sqlite3_str_appendf(p,"CREATE TABLE x(%s",argv[3]);
      for (local_74 = 4; local_74 < argc; local_74 = local_74 + 1) {
        if (*argv[local_74] == '+') {
          pRtree_00->nAux = pRtree_00->nAux + '\x01';
          sqlite3_str_appendf(p,",%s",argv[local_74] + 1);
        }
        else {
          if (pRtree_00->nAux != '\0') break;
          pRtree_00->nDim2 = pRtree_00->nDim2 + '\x01';
          sqlite3_str_appendf(p,",%s",argv[local_74]);
        }
      }
      sqlite3_str_appendf(p,");");
      pcVar3 = sqlite3_str_finish(p);
      if (pcVar3 == (char *)0x0) {
        pRtree._4_4_ = 7;
      }
      else if (local_74 < argc) {
        pcVar5 = sqlite3_mprintf("%s",aErrMsg[3]);
        *pzErr = pcVar5;
        pRtree._4_4_ = 1;
      }
      else {
        pRtree._4_4_ = sqlite3_declare_vtab(db,pcVar3);
        if (pRtree._4_4_ != 0) {
          pcVar5 = sqlite3_errmsg(db);
          pcVar5 = sqlite3_mprintf("%s",pcVar5);
          *pzErr = pcVar5;
        }
      }
      sqlite3_free(pcVar3);
      if (pRtree._4_4_ == 0) {
        uVar6 = (ulong)pRtree_00->nDim2 % 2;
        pRtree_00->nDim = pRtree_00->nDim2 / 2;
        if (pRtree_00->nDim == '\0') {
          local_78 = 2;
        }
        else if (pRtree_00->nDim2 < 0xb) {
          uVar6 = (ulong)pRtree_00->nDim2 % 2;
          local_78 = (uint)((int)uVar6 != 0);
        }
        else {
          local_78 = 3;
        }
        if (local_78 == 0) {
          pRtree_00->nBytesPerCell = pRtree_00->nDim2 * '\x04' + '\b';
          pRtree._4_4_ = getNodeSize(db,pRtree_00,isCreate,pzErr);
          if (pRtree._4_4_ == 0) {
            pRtree._4_4_ = rtreeSqlInit(pRtree_00,db,argv[1],argv[2],isCreate);
            if (pRtree._4_4_ == 0) {
              *ppVtab = (sqlite3_vtab *)pRtree_00;
              return 0;
            }
            pcVar3 = sqlite3_errmsg(db);
            pcVar3 = sqlite3_mprintf("%s",pcVar3);
            *pzErr = pcVar3;
          }
        }
        else {
          pcVar3 = sqlite3_mprintf("%s",aErrMsg[(long)(int)local_78 + -1],uVar6);
          *pzErr = pcVar3;
        }
      }
      if (pRtree._4_4_ == 0) {
        pRtree._4_4_ = 1;
      }
      rtreeRelease(pRtree_00);
      db_local._4_4_ = pRtree._4_4_;
    }
  }
  else {
    pcVar3 = sqlite3_mprintf("%s",aErrMsg[2]);
    *pzErr = pcVar3;
    db_local._4_4_ = 1;
  }
  return db_local._4_4_;
}

Assistant:

static int rtreeInit(
  sqlite3 *db,                        /* Database connection */
  void *pAux,                         /* One of the RTREE_COORD_* constants */
  int argc, const char *const*argv,   /* Parameters to CREATE TABLE statement */
  sqlite3_vtab **ppVtab,              /* OUT: New virtual table */
  char **pzErr,                       /* OUT: Error message, if any */
  int isCreate                        /* True for xCreate, false for xConnect */
){
  int rc = SQLITE_OK;
  Rtree *pRtree;
  int nDb;              /* Length of string argv[1] */
  int nName;            /* Length of string argv[2] */
  int eCoordType = (pAux ? RTREE_COORD_INT32 : RTREE_COORD_REAL32);
  sqlite3_str *pSql;
  char *zSql;
  int ii = 4;
  int iErr;

  const char *aErrMsg[] = {
    0,                                                    /* 0 */
    "Wrong number of columns for an rtree table",         /* 1 */
    "Too few columns for an rtree table",                 /* 2 */
    "Too many columns for an rtree table",                /* 3 */
    "Auxiliary rtree columns must be last"                /* 4 */
  };

  assert( RTREE_MAX_AUX_COLUMN<256 ); /* Aux columns counted by a u8 */
  if( argc>RTREE_MAX_AUX_COLUMN+3 ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[3]);
    return SQLITE_ERROR;
  }

  sqlite3_vtab_config(db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);

  /* Allocate the sqlite3_vtab structure */
  nDb = (int)strlen(argv[1]);
  nName = (int)strlen(argv[2]);
  pRtree = (Rtree *)sqlite3_malloc64(sizeof(Rtree)+nDb+nName+2);
  if( !pRtree ){
    return SQLITE_NOMEM;
  }
  memset(pRtree, 0, sizeof(Rtree)+nDb+nName+2);
  pRtree->nBusy = 1;
  pRtree->base.pModule = &rtreeModule;
  pRtree->zDb = (char *)&pRtree[1];
  pRtree->zName = &pRtree->zDb[nDb+1];
  pRtree->eCoordType = (u8)eCoordType;
  memcpy(pRtree->zDb, argv[1], nDb);
  memcpy(pRtree->zName, argv[2], nName);


  /* Create/Connect to the underlying relational database schema. If
  ** that is successful, call sqlite3_declare_vtab() to configure
  ** the r-tree table schema.
  */
  pSql = sqlite3_str_new(db);
  sqlite3_str_appendf(pSql, "CREATE TABLE x(%s", argv[3]);
  for(ii=4; ii<argc; ii++){
    if( argv[ii][0]=='+' ){
      pRtree->nAux++;
      sqlite3_str_appendf(pSql, ",%s", argv[ii]+1);
    }else if( pRtree->nAux>0 ){
      break;
    }else{
      pRtree->nDim2++;
      sqlite3_str_appendf(pSql, ",%s", argv[ii]);
    }
  }
  sqlite3_str_appendf(pSql, ");");
  zSql = sqlite3_str_finish(pSql);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else if( ii<argc ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[4]);
    rc = SQLITE_ERROR;
  }else if( SQLITE_OK!=(rc = sqlite3_declare_vtab(db, zSql)) ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }
  sqlite3_free(zSql);
  if( rc ) goto rtreeInit_fail;
  pRtree->nDim = pRtree->nDim2/2;
  if( pRtree->nDim<1 ){
    iErr = 2;
  }else if( pRtree->nDim2>RTREE_MAX_DIMENSIONS*2 ){
    iErr = 3;
  }else if( pRtree->nDim2 % 2 ){
    iErr = 1;
  }else{
    iErr = 0;
  }
  if( iErr ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[iErr]);
    goto rtreeInit_fail;
  }
  pRtree->nBytesPerCell = 8 + pRtree->nDim2*4;

  /* Figure out the node size to use. */
  rc = getNodeSize(db, pRtree, isCreate, pzErr);
  if( rc ) goto rtreeInit_fail;
  rc = rtreeSqlInit(pRtree, db, argv[1], argv[2], isCreate);
  if( rc ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    goto rtreeInit_fail;
  }

  *ppVtab = (sqlite3_vtab *)pRtree;
  return SQLITE_OK;

rtreeInit_fail:
  if( rc==SQLITE_OK ) rc = SQLITE_ERROR;
  assert( *ppVtab==0 );
  assert( pRtree->nBusy==1 );
  rtreeRelease(pRtree);
  return rc;
}